

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float RoundScalarWithFormat<float,float>(char *format,ImGuiDataType data_type,float v)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  undefined4 local_4c;
  char v_str [64];
  
  local_4c = v;
  pcVar2 = ImParseFormatFindStart(format);
  if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
    ImFormatString(v_str,0x40,pcVar2,(double)local_4c);
    pcVar2 = (char *)((long)&local_4c + 3);
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 == ' ');
    dVar3 = atof(pcVar2);
    local_4c = (float)dVar3;
  }
  return local_4c;
}

Assistant:

static inline TYPE RoundScalarWithFormat(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}